

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.h
# Opt level: O0

void image_32_filter_99_case(response_layer *layer,integral_image *iimage)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  float *pfVar7;
  long lVar8;
  long lVar9;
  float fVar10;
  undefined1 auVar11 [16];
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  integral_image *in_RSI;
  int *in_RDI;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  int y;
  int x;
  int t9;
  int t8;
  int t7;
  int t6;
  int t5;
  int t4;
  int t3;
  int t2;
  int t1;
  int t0;
  int j;
  int i;
  int k0;
  int k;
  int ind;
  bool *laplacian;
  float *response;
  int c01;
  int c00;
  int r01;
  int r00;
  int c11;
  int c10;
  int r11;
  int r10;
  float D1;
  float D0;
  float C1;
  float C0;
  float B1;
  float B0;
  float A1;
  float A0;
  float D;
  float C;
  float B;
  float A;
  float Dyy1;
  float Dyy0;
  float Dxy;
  float Dyy;
  float Dxx;
  float inv_area;
  int lobe;
  int border;
  int filter_size;
  int step;
  float *data;
  int iheight;
  int iwidth;
  int data_width;
  int width;
  int height;
  int local_fc;
  int local_f8;
  int local_bc;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  iVar2 = in_RDI[2];
  iVar3 = in_RDI[1];
  iVar4 = in_RSI->data_width;
  iVar5 = in_RSI->width;
  pfVar7 = in_RSI->data;
  iVar6 = in_RDI[3];
  iVar14 = *in_RDI;
  iVar12 = (iVar14 + -1) / 2;
  iVar13 = iVar14 / 3;
  fVar19 = 1.0 / (float)(iVar14 * iVar14);
  lVar8 = *(long *)(in_RDI + 4);
  lVar9 = *(long *)(in_RDI + 6);
  local_bc = 0;
  fVar1 = pfVar7[(in_RSI->height + -1) * iVar4 + iVar5 + -1];
  for (local_f8 = 0; local_f8 < iVar3 * iVar6 - iVar13 / 2; local_f8 = iVar6 + local_f8) {
    auVar11 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),
                              ZEXT416((uint)pfVar7[((local_f8 - iVar13 / 2) + -1 + iVar13) * iVar4 +
                                                   iVar5 + -1]),ZEXT416((uint)fVar1));
    fVar10 = fVar19 * auVar11._0_4_;
    iVar14 = local_f8 + iVar13 + -1;
    iVar15 = iVar13 / 2 + 1;
    iVar16 = (local_f8 - iVar13) + -1;
    for (local_fc = 0; local_fc < iVar3 * iVar6; local_fc = iVar6 + local_fc) {
      iVar17 = (local_fc - iVar13) + -1;
      iVar18 = local_fc + iVar13;
      fVar20 = box_integral_unconditional_opt
                         (in_RSI,local_f8 - iVar13,(local_fc - iVar12) + -1,iVar14,local_fc + iVar12
                         );
      auVar25._0_4_ =
           box_integral_unconditional_opt
                     (in_RSI,local_f8 - iVar13,local_fc - iVar15,iVar14,iVar18 - iVar15);
      auVar25._4_60_ = extraout_var;
      auVar11 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar25._0_16_,ZEXT416((uint)fVar20))
      ;
      fVar21 = box_integral_unconditional_opt(in_RSI,iVar16,local_fc,local_f8 + -1,iVar18);
      fVar22 = box_integral_unconditional_opt
                         (in_RSI,local_f8,iVar17,local_f8 + iVar13,local_fc + -1);
      fVar23 = box_integral_unconditional_opt(in_RSI,iVar16,iVar17,local_f8 + -1,local_fc + -1);
      fVar24 = box_integral_unconditional_opt(in_RSI,local_f8,local_fc,local_f8 + iVar13,iVar18);
      fVar20 = fVar19 * auVar11._0_4_;
      fVar21 = fVar19 * (((fVar21 + fVar22) - fVar23) - fVar24);
      auVar11 = vfmadd213ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)fVar20),
                                ZEXT416((uint)-(fVar21 * 0.81 * fVar21)));
      *(int *)(lVar8 + (long)local_bc * 4) = auVar11._0_4_;
      *(bool *)(lVar9 + local_bc) = 0.0 <= fVar20 + fVar10;
      local_bc = local_bc + 1;
    }
  }
  fVar10 = fVar19 * fVar1 * -2.0;
  for (; local_f8 < iVar13 / 2 + 1; local_f8 = iVar6 + local_f8) {
    iVar14 = local_f8 + iVar13 + -1;
    iVar15 = iVar13 / 2 + 1;
    iVar16 = (local_f8 - iVar13) + -1;
    for (local_fc = 0; local_fc < iVar3 * iVar6; local_fc = iVar6 + local_fc) {
      iVar17 = (local_fc - iVar13) + -1;
      iVar18 = local_fc + iVar13;
      fVar20 = box_integral_unconditional_opt
                         (in_RSI,local_f8 - iVar13,(local_fc - iVar12) + -1,iVar14,local_fc + iVar12
                         );
      auVar26._0_4_ =
           box_integral_unconditional_opt
                     (in_RSI,local_f8 - iVar13,local_fc - iVar15,iVar14,iVar18 - iVar15);
      auVar26._4_60_ = extraout_var_00;
      auVar11 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar26._0_16_,ZEXT416((uint)fVar20))
      ;
      fVar21 = box_integral_unconditional_opt(in_RSI,iVar16,local_fc,local_f8 + -1,iVar18);
      fVar22 = box_integral_unconditional_opt
                         (in_RSI,local_f8,iVar17,local_f8 + iVar13,local_fc + -1);
      fVar23 = box_integral_unconditional_opt(in_RSI,iVar16,iVar17,local_f8 + -1,local_fc + -1);
      fVar24 = box_integral_unconditional_opt(in_RSI,local_f8,local_fc,local_f8 + iVar13,iVar18);
      fVar20 = fVar19 * auVar11._0_4_;
      fVar21 = fVar19 * (((fVar21 + fVar22) - fVar23) - fVar24);
      auVar11 = vfmadd213ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)fVar20),
                                ZEXT416((uint)-(fVar21 * 0.81 * fVar21)));
      *(int *)(lVar8 + (long)local_bc * 4) = auVar11._0_4_;
      *(bool *)(lVar9 + local_bc) = 0.0 <= fVar20 + fVar10;
      local_bc = local_bc + 1;
    }
  }
  for (; local_f8 < iVar2 * iVar6; local_f8 = iVar6 + local_f8) {
    auVar11 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),
                              ZEXT416((uint)pfVar7[((local_f8 - iVar13 / 2) + -1) * iVar4 +
                                                   iVar5 + -1]),ZEXT416((uint)-(fVar1 * 2.0)));
    fVar10 = fVar19 * auVar11._0_4_;
    iVar14 = local_f8 + iVar13 + -1;
    iVar15 = iVar13 / 2 + 1;
    iVar16 = (local_f8 - iVar13) + -1;
    for (local_fc = 0; local_fc < iVar3 * iVar6; local_fc = iVar6 + local_fc) {
      iVar17 = (local_fc - iVar13) + -1;
      iVar18 = local_fc + iVar13;
      fVar20 = box_integral_unconditional_opt
                         (in_RSI,local_f8 - iVar13,(local_fc - iVar12) + -1,iVar14,local_fc + iVar12
                         );
      auVar27._0_4_ =
           box_integral_unconditional_opt
                     (in_RSI,local_f8 - iVar13,local_fc - iVar15,iVar14,iVar18 - iVar15);
      auVar27._4_60_ = extraout_var_01;
      auVar11 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar27._0_16_,ZEXT416((uint)fVar20))
      ;
      fVar21 = box_integral_unconditional_opt(in_RSI,iVar16,local_fc,local_f8 + -1,iVar18);
      fVar22 = box_integral_unconditional_opt
                         (in_RSI,local_f8,iVar17,local_f8 + iVar13,local_fc + -1);
      fVar23 = box_integral_unconditional_opt(in_RSI,iVar16,iVar17,local_f8 + -1,local_fc + -1);
      fVar24 = box_integral_unconditional_opt(in_RSI,local_f8,local_fc,local_f8 + iVar13,iVar18);
      fVar20 = fVar19 * auVar11._0_4_;
      fVar21 = fVar19 * (((fVar21 + fVar22) - fVar23) - fVar24);
      auVar11 = vfmadd213ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)fVar20),
                                ZEXT416((uint)-(fVar21 * 0.81 * fVar21)));
      *(int *)(lVar8 + (long)local_bc * 4) = auVar11._0_4_;
      *(bool *)(lVar9 + local_bc) = 0.0 <= fVar20 + fVar10;
      local_bc = local_bc + 1;
    }
  }
  return;
}

Assistant:

inline void image_32_filter_99_case(struct response_layer *layer, struct integral_image *iimage) {
    int height = layer->height;
    int width = layer->width;

    int data_width = iimage->data_width;

    int iwidth = iimage->width;
    int iheight = iimage->height;

    float *data = (float *) iimage->data;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int border = (filter_size - 1) / 2;
    int lobe = filter_size / 3;
    float inv_area = 1.f/(filter_size*filter_size);

    float Dxx, Dyy, Dxy, Dyy0, Dyy1, A, B, C, D;
    float A0, A1, B0, B1, C0, C1, D0, D1;
    int r10, r11, c10, c11, r00, r01, c00, c01;
    float* response = layer->response;
    bool* laplacian = layer->laplacian;

    int ind = 0;

    int k, k0, i, j, t0, t1, t2, t3, t4, t5, t6, t7, t8, t9;
    int x = 0;
    int y = 0;

    // Case 2.2a the filter is longer and wider than the image.

    // D is right bottom corner or to the right (possibly below image)
    // A, B, C = 0
    D0 = data[(iheight-1) * data_width + (iwidth-1)];


    // We divide it again in 3 parts.
    // 1. B outside, D inside
    // 2. B outside, D outside
    // 3. B inside, D outside

    // 1. Case: B outside, D inside
    for (x = 0; x < width*step-lobe/2; x += step) {
        // negative part
        r10 = x - lobe / 2 - 1;
        r11 = r10 + lobe;  // TODO: fix this

        D1 = data[r11 * data_width + (iwidth-1)];

        // Compute Dyy
        Dyy = D0 - 3 * D1;
        Dyy *= inv_area;

        // precompute
        t0 = x - lobe;
        t1 = x + lobe - 1;
        t2 = lobe/2 + 1;
        t3 = x - 1;
        t5 = x - lobe - 1;
        t7 = x + lobe;

        for (y = 0; y < width * step; y += step) {
            // box_integral_unconditional precompute
            t4 = y - 1;
            t6 = y - lobe - 1;
            t8 = y + lobe;

            // Compute Dxx, Dxy
            Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
            Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                    + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                    - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                    - box_integral_unconditional_opt(iimage, x, y, t7, t8);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = Dxx + Dyy >= 0;
            ind += 1;
        }
    }

    // 2. Case: B outside, D outside
    Dyy = - 2 * D0;
    Dyy *= inv_area;

    for (; x < lobe/2+1; x += step) {

        // precompute
        t0 = x - lobe;
        t1 = x + lobe - 1;
        t2 = lobe/2 + 1;
        t3 = x - 1;
        t5 = x - lobe - 1;
        t7 = x + lobe;

        for (y = 0; y < width*step; y += step) {
            // box_integral_unconditional precompute
            t4 = y - 1;
            t6 = y - lobe - 1;
            t8 = y + lobe;

            // Compute Dxx, Dxy
            Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
            Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                    + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                    - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                    - box_integral_unconditional_opt(iimage, x, y, t7, t8);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = Dxx + Dyy >= 0;
            ind += 1;
        }
    }

    // 3. Case: B inside, D outside
    for (; x < height * step; x += step) {
        r10 = x - lobe / 2 - 1;

        B = data[r10 * data_width + (iwidth-1)];
        // D1 = D0 - B;
        // Dyy = D0 - 3 * D1;
        // Dyy *= inv_area;

        // this can be simplified to:
        // (small difference in original is this but error is <0.000001 eps)
        Dyy = 3*B - 2*D0;
        Dyy *= inv_area;

        // precompute
        t0 = x - lobe;
        t1 = x + lobe - 1;
        t2 = lobe/2 + 1;
        t3 = x - 1;
        t5 = x - lobe - 1;
        t7 = x + lobe;

        for (y = 0; y < width * step; y += step) {
            // box_integral_unconditional precompute
            t4 = y - 1;
            t6 = y - lobe - 1;
            t8 = y + lobe;

            // Compute Dxx, Dxy
            Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
            Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                    + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                    - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                    - box_integral_unconditional_opt(iimage, x, y, t7, t8);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = Dxx + Dyy >= 0;
            ind += 1;
        }
    }
}